

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall wasm::TranslateToFuzzReader::addHashMemorySupport(TranslateToFuzzReader *this)

{
  Module *pMVar1;
  unique_ptr *puVar2;
  bool bVar3;
  TranslateToFuzzReader *pTVar4;
  uint32_t uVar5;
  Const *pCVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  Expression *value;
  undefined8 *puVar10;
  char *pcVar11;
  long lVar12;
  ulong extraout_RDX;
  ulong uVar13;
  ulong uVar14;
  optional<wasm::Type> type;
  Name NVar15;
  initializer_list<wasm::Type> __l;
  string_view sVar16;
  Name NVar17;
  Name NVar18;
  Type local_c8;
  Literal local_c0;
  undefined1 local_a8 [8];
  Literal zero;
  undefined1 auStack_88 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> contents;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_68;
  TranslateToFuzzReader *local_50;
  allocator_type local_41;
  Builder *local_40;
  Function *local_38;
  
  uVar5 = Random::upTo(&this->random,2);
  if (uVar5 != 0) {
    auStack_88 = (undefined1  [8])0x0;
    contents.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    contents.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_40 = &this->builder;
    pCVar6 = Builder::makeConst<unsigned_int>(local_40,0x1505);
    local_a8 = (undefined1  [8])Builder::makeLocalSet(local_40,0,(Expression *)pCVar6);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_88,
               (Expression **)local_a8);
    Literal::makeFromInt32
              ((Literal *)local_a8,0,(Type)*(uintptr_t *)(**(long **)(this->wasm + 0x78) + 0x50));
    local_50 = this;
    if ((this->fuzzParams->super_FuzzParams).USABLE_MEMORY.addr != 0) {
      uVar13 = 0;
      uVar14 = 1;
      do {
        puVar7 = (undefined1 *)MixedArena::allocSpace((MixedArena *)(local_40->wasm + 0x200),0x18,8)
        ;
        *puVar7 = 8;
        *(undefined4 *)(puVar7 + 0x10) = 0;
        *(undefined8 *)(puVar7 + 8) = 2;
        pCVar6 = Builder::makeConst<unsigned_int>(local_40,5);
        puVar8 = (undefined1 *)MixedArena::allocSpace((MixedArena *)(local_40->wasm + 0x200),0x28,8)
        ;
        *puVar8 = 0x10;
        *(undefined8 *)(puVar8 + 8) = 0;
        *(undefined4 *)(puVar8 + 0x10) = 10;
        *(undefined1 **)(puVar8 + 0x18) = puVar7;
        *(Const **)(puVar8 + 0x20) = pCVar6;
        wasm::Binary::finalize();
        puVar7 = (undefined1 *)MixedArena::allocSpace((MixedArena *)(local_40->wasm + 0x200),0x18,8)
        ;
        *puVar7 = 8;
        *(undefined4 *)(puVar7 + 0x10) = 0;
        *(undefined8 *)(puVar7 + 8) = 2;
        puVar9 = (undefined1 *)MixedArena::allocSpace((MixedArena *)(local_40->wasm + 0x200),0x28,8)
        ;
        *puVar9 = 0x10;
        *(undefined8 *)(puVar9 + 8) = 0;
        *(undefined4 *)(puVar9 + 0x10) = 0;
        *(undefined1 **)(puVar9 + 0x18) = puVar8;
        *(undefined1 **)(puVar9 + 0x20) = puVar7;
        wasm::Binary::finalize();
        wasm::Literal::Literal(&local_c0,(Literal *)local_a8);
        pCVar6 = Builder::makeConst(local_40,&local_c0);
        local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)**(long **)(local_50->wasm + 0x78);
        local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((undefined8 *)**(long **)(local_50->wasm + 0x78))[1];
        puVar7 = (undefined1 *)
                 MixedArena::allocSpace((MixedArena *)((local_50->builder).wasm + 0x200),0x48,8);
        *puVar7 = 0xc;
        puVar7[0x28] = 0;
        *(undefined2 *)(puVar7 + 0x10) = 1;
        *(ulong *)(puVar7 + 0x18) = uVar13;
        *(undefined8 *)(puVar7 + 0x20) = 1;
        *(Const **)(puVar7 + 0x30) = pCVar6;
        *(undefined8 *)(puVar7 + 8) = 2;
        *(pointer *)(puVar7 + 0x38) =
             local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)(puVar7 + 0x40) =
             local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
        wasm::Load::finalize();
        value = (Expression *)MixedArena::allocSpace((MixedArena *)(local_40->wasm + 0x200),0x28,8);
        value->_id = BinaryId;
        (value->type).id = 0;
        *(undefined4 *)(value + 1) = 9;
        value[1].type.id = (uintptr_t)puVar9;
        *(undefined1 **)(value + 2) = puVar7;
        wasm::Binary::finalize();
        local_38 = (Function *)Builder::makeLocalSet(local_40,0,value);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_88,
                   (Expression **)&local_38);
        wasm::Literal::~Literal(&local_c0);
        bVar3 = uVar14 < (local_50->fuzzParams->super_FuzzParams).USABLE_MEMORY.addr;
        uVar13 = uVar14;
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (bVar3);
    }
    pTVar4 = local_50;
    local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)MixedArena::allocSpace((MixedArena *)(local_40->wasm + 0x200),0x18,8);
    *(undefined1 *)
     &(local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_start)->id = 8;
    *(undefined4 *)
     &local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start[2].id = 0;
    local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start[1].id = 2;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_88,
               (Expression **)&local_68);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
    Builder::makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
              (local_40,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                        auStack_88,type);
    pMVar1 = pTVar4->wasm;
    NVar15.super_IString.str = (IString)wasm::IString::interned(10,"hashMemory",0);
    sVar16 = (string_view)Names::getValidFunctionName(pMVar1,NVar15);
    (local_50->hashMemoryName).super_IString.str = sVar16;
    puVar2 = (unique_ptr *)local_50->wasm;
    wasm::HeapType::HeapType((HeapType *)&zero.type,(Signature)(ZEXT816(2) << 0x40));
    local_c8.id = 2;
    __l._M_len = 1;
    __l._M_array = &local_c8;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_68,__l,&local_41);
    NVar15.super_IString.str._M_str = (char *)sVar16._M_len;
    NVar15.super_IString.str._M_len = (size_t)&local_38;
    Builder::makeFunction
              (NVar15,(HeapType)sVar16._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)zero.type.id,
               (Expression *)&local_68);
    puVar10 = (undefined8 *)wasm::Module::addFunction(puVar2);
    pTVar4 = local_50;
    if (local_38 != (Function *)0x0) {
      std::default_delete<wasm::Function>::operator()
                ((default_delete<wasm::Function> *)&local_38,local_38);
    }
    local_38 = (Function *)0x0;
    if (local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (pTVar4->preserveImportsAndExports == false) {
      pMVar1 = pTVar4->wasm;
      pcVar11 = (char *)wasm::IString::interned(10,"hashMemory",0);
      NVar17.super_IString.str._M_str = pcVar11;
      NVar17.super_IString.str._M_len = (size_t)pMVar1;
      lVar12 = wasm::Module::getExportOrNull(NVar17);
      if (lVar12 == 0) {
        puVar2 = (unique_ptr *)pTVar4->wasm;
        sVar16 = (string_view)wasm::IString::interned(10,"hashMemory",0);
        local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*puVar10;
        local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)puVar10[1];
        local_38 = (Function *)operator_new(0x30);
        (local_38->super_Importable).module.super_IString.str._M_len =
             (size_t)local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (local_38->super_Importable).module.super_IString.str._M_str =
             (char *)local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        (local_38->super_Importable).super_Named.name.super_IString.str = sVar16;
        *(undefined4 *)&(local_38->super_Importable).super_Named.hasExplicitName = 0;
        *(undefined1 *)&(local_38->super_Importable).base.super_IString.str._M_len = 0;
        wasm::Module::addExport(puVar2);
        if (local_38 != (Function *)0x0) {
          operator_delete(local_38,0x30);
        }
        pMVar1 = pTVar4->wasm;
        pcVar11 = (char *)wasm::IString::interned(6,"memory",0);
        NVar18.super_IString.str._M_str = pcVar11;
        NVar18.super_IString.str._M_len = (size_t)pMVar1;
        lVar12 = wasm::Module::getExportOrNull(NVar18);
        if (lVar12 == 0) {
          puVar2 = (unique_ptr *)pTVar4->wasm;
          sVar16 = (string_view)wasm::IString::interned(6,"memory",0);
          local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start = *(pointer *)**(long **)(pTVar4->wasm + 0x78);
          local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((undefined8 *)**(long **)(pTVar4->wasm + 0x78))[1];
          local_38 = (Function *)operator_new(0x30);
          (local_38->super_Importable).module.super_IString.str._M_len =
               (size_t)local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                       super__Vector_impl_data._M_start;
          (local_38->super_Importable).module.super_IString.str._M_str =
               (char *)local_68.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          (local_38->super_Importable).super_Named.name.super_IString.str = sVar16;
          *(undefined4 *)&(local_38->super_Importable).super_Named.hasExplicitName = 2;
          *(undefined1 *)&(local_38->super_Importable).base.super_IString.str._M_len = 0;
          wasm::Module::addExport(puVar2);
          if (local_38 != (Function *)0x0) {
            operator_delete(local_38,0x30);
          }
        }
      }
    }
    wasm::Literal::~Literal((Literal *)local_a8);
    if (auStack_88 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_88,
                      (long)contents.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_88);
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addHashMemorySupport() {
  // Don't always add this.
  if (oneIn(2)) {
    return;
  }

  // Add memory hasher helper (for the hash, see hash.h). The function looks
  // like:
  // function hashMemory() {
  //   hash = 5381;
  //   hash = ((hash << 5) + hash) ^ mem[0];
  //   hash = ((hash << 5) + hash) ^ mem[1];
  //   ..
  //   return hash;
  // }
  std::vector<Expression*> contents;
  contents.push_back(
    builder.makeLocalSet(0, builder.makeConst(uint32_t(5381))));
  auto zero = Literal::makeFromInt32(0, wasm.memories[0]->addressType);
  for (Index i = 0; i < fuzzParams->USABLE_MEMORY; i++) {
    contents.push_back(builder.makeLocalSet(
      0,
      builder.makeBinary(
        XorInt32,
        builder.makeBinary(
          AddInt32,
          builder.makeBinary(ShlInt32,
                             builder.makeLocalGet(0, Type::i32),
                             builder.makeConst(uint32_t(5))),
          builder.makeLocalGet(0, Type::i32)),
        builder.makeLoad(1,
                         false,
                         i,
                         1,
                         builder.makeConst(zero),
                         Type::i32,
                         wasm.memories[0]->name))));
  }
  contents.push_back(builder.makeLocalGet(0, Type::i32));
  auto* body = builder.makeBlock(contents);
  hashMemoryName = Names::getValidFunctionName(wasm, "hashMemory");
  auto* hasher = wasm.addFunction(builder.makeFunction(
    hashMemoryName, Signature(Type::none, Type::i32), {Type::i32}, body));

  if (!preserveImportsAndExports && !wasm.getExportOrNull("hashMemory")) {
    wasm.addExport(
      builder.makeExport("hashMemory", hasher->name, ExternalKind::Function));
    // Export memory so JS fuzzing can use it
    if (!wasm.getExportOrNull("memory")) {
      wasm.addExport(builder.makeExport(
        "memory", wasm.memories[0]->name, ExternalKind::Memory));
    }
  }
}